

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::addQualifierToExisting
          (TParseContext *this,TSourceLoc *loc,TQualifier qualifier,TString *identifier)

{
  TIntermediate *pTVar1;
  bool bVar2;
  int iVar3;
  TSymbol *shared;
  undefined4 extraout_var;
  TPoolAllocator *this_00;
  TVariable *this_01;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TQualifier *qualifier_00;
  const_iterator cVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar5;
  undefined4 extraout_var_04;
  pointer pcVar6;
  char *pcVar7;
  ulong uVar8;
  _func_int **pp_Var9;
  _func_int *UNRECOVERED_JUMPTABLE;
  TType blockType;
  TTypeList local_188;
  TType local_160;
  TType local_c8;
  
  shared = TSymbolTable::find((this->super_TParseContextBase).symbolTable,identifier,(bool *)0x0,
                              (bool *)0x0,(int *)0x0);
  if (shared == (TSymbol *)0x0) {
    if (qualifier.layoutBufferReference != true) {
      pcVar6 = (identifier->_M_dataplus)._M_p;
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar7 = "identifier not previously declared";
      goto LAB_004c360a;
    }
    if ((~qualifier._36_8_ & 0x1f8000000000000) != 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                (this,loc,
                 "the buffer_reference_align layout is ignored when defined in forward declaration",
                 (identifier->_M_dataplus)._M_p,"");
    }
    if ((qualifier._16_1_ & 0xf) != 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                (this,loc,
                 "the packing layout (scalar, std430, etc) is ignored when defined in forward declaration"
                 ,(identifier->_M_dataplus)._M_p,"");
    }
    local_188.super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_188.super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
    super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
    local_188.super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
    super__Tp_alloc_type.allocator = GetThreadPoolAllocator();
    local_188.super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TType::TType(&local_c8,&local_188,identifier,&qualifier);
    TType::TType(&local_160,EbtReference,&local_c8,identifier);
    this_00 = GetThreadPoolAllocator();
    this_01 = (TVariable *)TPoolAllocator::allocate(this_00,0xf8);
    TVariable::TVariable(this_01,identifier,identifier,&local_160,true);
    bVar2 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)this_01);
    if (bVar2) {
      return;
    }
    pcVar6 = (this->blockName->_M_dataplus)._M_p;
    pp_Var9 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar7 = "block name cannot redefine a non-block name";
  }
  else {
    iVar3 = (*shared->_vptr_TSymbol[7])(shared);
    if (CONCAT44(extraout_var,iVar3) != 0) {
      pcVar6 = (identifier->_M_dataplus)._M_p;
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar7 = "cannot re-qualify a function name";
LAB_004c360a:
      (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar7,pcVar6,"",UNRECOVERED_JUMPTABLE);
      return;
    }
    if (((((CONCAT44(qualifier._12_4_,qualifier._8_4_) & 0x3fff1e0e0000000) == 0) &&
         (bVar2 = TQualifier::hasNonXfbLayout(&qualifier), !bVar2)) &&
        ((qualifier._36_4_ & 0x7fffffff) == 0x7fffffff)) && ((qualifier._8_4_ & 0xe00007f) == 0)) {
      iVar3 = (*shared->_vptr_TSymbol[0x14])(shared);
      if ((char)iVar3 != '\0') {
        shared = TSymbolTable::copyUp((this->super_TParseContextBase).symbolTable,shared);
      }
      if (((uint)qualifier._8_4_ >> 0x1c & 1) != 0) {
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        cVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                ::find(&(pTVar1->ioAccessed)._M_t,identifier);
        if ((_Rb_tree_header *)cVar4._M_node !=
            &(pTVar1->ioAccessed)._M_t._M_impl.super__Rb_tree_header) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot change qualification after use","invariant","");
        }
        iVar3 = (*shared->_vptr_TSymbol[0xd])(shared);
        lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x50))
                          ((long *)CONCAT44(extraout_var_00,iVar3));
        *(byte *)(lVar5 + 0xb) = *(byte *)(lVar5 + 0xb) | 0x10;
        iVar3 = (*shared->_vptr_TSymbol[0xc])(shared);
        qualifier_00 = (TQualifier *)
                       (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x58))
                                 ((long *)CONCAT44(extraout_var_01,iVar3));
        invariantCheck(this,loc,qualifier_00);
        return;
      }
      if ((qualifier._12_4_ & 0x10) != 0) {
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        cVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                ::find(&(pTVar1->ioAccessed)._M_t,identifier);
        if ((_Rb_tree_header *)cVar4._M_node !=
            &(pTVar1->ioAccessed)._M_t._M_impl.super__Rb_tree_header) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot change qualification after use","precise","");
        }
        iVar3 = (*shared->_vptr_TSymbol[0xd])(shared);
        lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x50))
                          ((long *)CONCAT44(extraout_var_02,iVar3));
        *(ulong *)(lVar5 + 8) = *(ulong *)(lVar5 + 8) | 0x1000000000;
        return;
      }
      if ((qualifier._12_4_ & 1) == 0) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                  (this,loc,"unknown requalification","","");
        return;
      }
      iVar3 = (*shared->_vptr_TSymbol[0xd])(shared);
      lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x50))
                        ((long *)CONCAT44(extraout_var_03,iVar3));
      *(ulong *)(lVar5 + 8) = (*(ulong *)(lVar5 + 8) & 0xfffffffeffffff80) + 0x100000002;
      uVar8 = qualifier._36_8_ & 0x7ff0000000000;
      if (uVar8 == 0x7ff0000000000) {
        return;
      }
      iVar3 = (*shared->_vptr_TSymbol[0xd])(shared);
      lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x50))
                        ((long *)CONCAT44(extraout_var_04,iVar3));
      *(ulong *)(lVar5 + 0x24) = *(ulong *)(lVar5 + 0x24) & 0xfff800ffffffffff | uVar8;
      return;
    }
    pcVar6 = (identifier->_M_dataplus)._M_p;
    pp_Var9 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar7 = 
    "cannot add storage, auxiliary, memory, interpolation, layout, or precision qualifier to an existing variable"
    ;
  }
  (*pp_Var9[0x2d])(this,loc,pcVar7,pcVar6,"");
  return;
}

Assistant:

void TParseContext::addQualifierToExisting(const TSourceLoc& loc, TQualifier qualifier, const TString& identifier)
{
    TSymbol* symbol = symbolTable.find(identifier);

    // A forward declaration of a block reference looks to the grammar like adding
    // a qualifier to an existing symbol. Detect this and create the block reference
    // type with an empty type list, which will be filled in later in
    // TParseContext::declareBlock.
    if (!symbol && qualifier.hasBufferReference()) {
        // The layout qualifiers are ignored in forward declaration, give warning for the most probable to be seen
        if (qualifier.hasBufferReferenceAlign()) {
            warn(loc, "the buffer_reference_align layout is ignored when defined in forward declaration",
                 identifier.c_str(), "");
        }
        if (qualifier.hasPacking()) {
            warn(loc, "the packing layout (scalar, std430, etc) is ignored when defined in forward declaration",
                 identifier.c_str(), "");
        }
        TTypeList typeList;
        TType blockType(&typeList, identifier, qualifier);
        TType blockNameType(EbtReference, blockType, identifier);
        TVariable* blockNameVar = new TVariable(&identifier, blockNameType, true);
        if (! symbolTable.insert(*blockNameVar)) {
            error(loc, "block name cannot redefine a non-block name", blockName->c_str(), "");
        }
        return;
    }

    if (! symbol) {
        error(loc, "identifier not previously declared", identifier.c_str(), "");
        return;
    }
    if (symbol->getAsFunction()) {
        error(loc, "cannot re-qualify a function name", identifier.c_str(), "");
        return;
    }

    if (qualifier.isAuxiliary() ||
        qualifier.isMemory() ||
        qualifier.isInterpolation() ||
        qualifier.hasLayout() ||
        qualifier.storage != EvqTemporary ||
        qualifier.precision != EpqNone) {
        error(loc, "cannot add storage, auxiliary, memory, interpolation, layout, or precision qualifier to an existing variable", identifier.c_str(), "");
        return;
    }

    // For read-only built-ins, add a new symbol for holding the modified qualifier.
    // This will bring up an entire block, if a block type has to be modified (e.g., gl_Position inside a block)
    if (symbol->isReadOnly())
        symbol = symbolTable.copyUp(symbol);

    if (qualifier.invariant) {
        if (intermediate.inIoAccessed(identifier))
            error(loc, "cannot change qualification after use", "invariant", "");
        symbol->getWritableType().getQualifier().invariant = true;
        invariantCheck(loc, symbol->getType().getQualifier());
    } else if (qualifier.isNoContraction()) {
        if (intermediate.inIoAccessed(identifier))
            error(loc, "cannot change qualification after use", "precise", "");
        symbol->getWritableType().getQualifier().setNoContraction();
    } else if (qualifier.specConstant) {
        symbol->getWritableType().getQualifier().makeSpecConstant();
        if (qualifier.hasSpecConstantId())
            symbol->getWritableType().getQualifier().layoutSpecConstantId = qualifier.layoutSpecConstantId;
    } else
        warn(loc, "unknown requalification", "", "");
}